

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Counter.cpp
# Opt level: O1

void __thiscall
Counter::Reset(Counter *this,shared_ptr<myvk::CommandPool> *command_pool,uint32_t value)

{
  enable_shared_from_this<myvk::Base> *peVar1;
  Buffer *this_00;
  _func_int **this_01;
  uint32_t *puVar2;
  shared_ptr<myvk::Fence> *fence;
  initializer_list<VkBufferCopy> __l;
  shared_ptr<myvk::CommandBuffer> command_buffer;
  allocator_type local_81;
  CommandBuffer local_80;
  vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> local_50;
  VkBufferCopy local_38;
  
  myvk::CommandBuffer::Create(&local_80,command_pool,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  this_00 = (this->m_staging_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if ((uint32_t *)this_00->m_mapped_ptr == (uint32_t *)0x0) {
    puVar2 = (uint32_t *)myvk::Buffer::Map(this_00);
    *puVar2 = value;
    myvk::Buffer::Unmap(this_00);
  }
  else {
    *(uint32_t *)this_00->m_mapped_ptr = value;
  }
  myvk::CommandBuffer::Begin
            ((CommandBuffer *)local_80.super_DeviceObjectBase.super_Base._vptr_Base,1);
  this_01 = local_80.super_DeviceObjectBase.super_Base._vptr_Base;
  local_80.m_command_pool_ptr.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (this->m_staging_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_80.m_command_buffer =
       (VkCommandBuffer)
       (this->m_staging_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.m_command_buffer !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.m_command_buffer)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.m_command_buffer)->_M_use_count
           + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.m_command_buffer)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.m_command_buffer)->_M_use_count
           + 1;
    }
  }
  local_80.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (this->m_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_80.m_command_pool_ptr.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           (this->m_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (local_80.m_command_pool_ptr.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      peVar1 = &((local_80.m_command_pool_ptr.
                  super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>;
      *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1;
      UNLOCK();
    }
    else {
      peVar1 = &((local_80.m_command_pool_ptr.
                  super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>;
      *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1;
    }
  }
  local_38.srcOffset = 0;
  local_38.dstOffset = 0;
  local_38.size = 4;
  __l._M_len = 1;
  __l._M_array = &local_38;
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::vector(&local_50,__l,&local_81);
  myvk::CommandBuffer::CmdCopy
            ((CommandBuffer *)this_01,
             (Ptr<BufferBase> *)
             &local_80.m_command_pool_ptr.
              super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Ptr<BufferBase> *)
             ((long)&local_80.super_DeviceObjectBase.super_Base.
                     super_enable_shared_from_this<myvk::Base>._M_weak_this.
                     super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2> + 8),&local_50);
  if (local_50.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.m_command_pool_ptr.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_80.m_command_pool_ptr.
               super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.m_command_buffer !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.m_command_buffer);
  }
  myvk::CommandBuffer::End((CommandBuffer *)local_80.super_DeviceObjectBase.super_Base._vptr_Base);
  fence = &this->m_fence;
  myvk::CommandBuffer::Submit
            ((CommandBuffer *)local_80.super_DeviceObjectBase.super_Base._vptr_Base,fence);
  myvk::Fence::Wait((fence->super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                    0xffffffffffffffff);
  myvk::Fence::Reset((fence->super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (local_80.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
      _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_80.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
               _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void Counter::Reset(const std::shared_ptr<myvk::CommandPool> &command_pool, uint32_t value) {
	std::shared_ptr<myvk::CommandBuffer> command_buffer = myvk::CommandBuffer::Create(command_pool);
	m_staging_buffer->UpdateData((uint32_t)value, 0);
	command_buffer->Begin(VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT);
	command_buffer->CmdCopy(m_staging_buffer, m_buffer, {{0, 0, sizeof(uint32_t)}});
	command_buffer->End();
	command_buffer->Submit(m_fence);
	m_fence->Wait();
	m_fence->Reset();
}